

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::insert_example
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,bool fake_insert)

{
  node *pnVar1;
  size_t sVar2;
  byte in_CL;
  uint *in_RDX;
  long in_RDI;
  float fVar3;
  example *in_stack_00000038;
  float leaf_pred;
  uint32_t newcn;
  float router_pred;
  uint32_t cn;
  single_learner *in_stack_00000068;
  memory_tree *in_stack_00000070;
  uint32_t in_stack_00000184;
  single_learner *in_stack_00000188;
  memory_tree *in_stack_00000190;
  uint *in_stack_ffffffffffffff98;
  v_array<unsigned_int> *in_stack_ffffffffffffffa0;
  uint local_20;
  
  local_20 = 0;
  while( true ) {
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    if (pnVar1->internal != 1) break;
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(ulong)*in_RDX);
    fVar3 = train_node(in_stack_00000070,in_stack_00000068,(example *)b,base._4_4_);
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    local_20 = insert_descent(pnVar1,fVar3);
  }
  if (*(int *)(in_RDI + 0xcc) == 1) {
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(ulong)*in_RDX);
    train_one_against_some_at_leaf
              ((memory_tree *)ec_array_index,(single_learner *)CONCAT17(fake_insert,_cn),
               (uint32_t)router_pred,in_stack_00000038);
  }
  pnVar1 = v_array<memory_tree_ns::node>::operator[]
                     ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
  if ((pnVar1->internal == -1) && ((in_CL & 1) == 0)) {
    v_array<memory_tree_ns::node>::operator[]
              ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    v_array<unsigned_int>::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    sVar2 = v_array<unsigned_int>::size(&pnVar1->examples_index);
    if (*(ulong *)(in_RDI + 0x98) < sVar2) {
      pnVar1 = v_array<memory_tree_ns::node>::operator[]
                         ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
      sVar2 = v_array<unsigned_int>::size(&pnVar1->examples_index);
      *(size_t *)(in_RDI + 0x98) = sVar2;
    }
    v_array<example_*>::operator[]((v_array<example_*> *)(in_RDI + 0x28),(ulong)*in_RDX);
    fVar3 = train_node(in_stack_00000070,in_stack_00000068,(example *)b,base._4_4_);
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    insert_descent(pnVar1,fVar3);
    pnVar1 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(in_RDI + 8),(ulong)local_20);
    sVar2 = v_array<unsigned_int>::size(&pnVar1->examples_index);
    if ((*(ulong *)(in_RDI + 0x48) <= sVar2) &&
       (sVar2 = v_array<memory_tree_ns::node>::size((v_array<memory_tree_ns::node> *)(in_RDI + 8)),
       sVar2 + 2 <= *(ulong *)(in_RDI + 0x50))) {
      split_leaf(in_stack_00000190,in_stack_00000188,in_stack_00000184);
    }
  }
  return;
}

Assistant:

void insert_example(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, bool fake_insert = false)
    {
        uint32_t cn = 0; //start from the root.
        while(b.nodes[cn].internal == 1) //if it's internal node:
        {   
            //predict and train the node at cn.
            float router_pred = train_node(b, base, *b.examples[ec_array_index], cn); 
            uint32_t newcn = insert_descent(b.nodes[cn], router_pred); //updated nr or nl
            cn = newcn; 
        }
    
        if (b.oas == true)  //if useing oas as inference procedure, we just train oas here, as it's independent of the memory unit anyway'
            train_one_against_some_at_leaf(b, base, cn, *b.examples[ec_array_index]);

        if((b.nodes[cn].internal == -1) && (fake_insert == false)) //get to leaf:
        {   
            b.nodes[cn].examples_index.push_back(ec_array_index);
            if (b.nodes[cn].examples_index.size() > b.max_ex_in_leaf)
            {
                b.max_ex_in_leaf = b.nodes[cn].examples_index.size();
            }
            float leaf_pred = train_node(b, base, *b.examples[ec_array_index], cn); //tain the leaf as well.
            insert_descent(b.nodes[cn], leaf_pred); //this is a faked descent, the purpose is only to update nl and nr of cn

            //if the number of examples exceeds the max_leaf_examples, and not reach the max_nodes - 2 yet, we split:
            if((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 <= b.max_nodes)){
                split_leaf(b, base, cn); 
            }
        }
    }